

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

CK_C_GetFunctionList loadLibrary(char *module,void **moduleHandle,char **pErrMsg)

{
  long lVar1;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  void *pDynLib;
  CK_C_GetFunctionList pGetFunctionList;
  long local_30;
  CK_C_GetFunctionList local_8;
  
  if (in_RDI == 0) {
    local_30 = dlopen("/usr/local/lib/softhsm/libsofthsm2.so",2);
  }
  else {
    local_30 = dlopen(in_RDI,2);
  }
  lVar1 = dlerror();
  *in_RDX = lVar1;
  if ((local_30 == 0) || (*in_RDX != 0)) {
    if (local_30 != 0) {
      dlclose(local_30);
    }
    local_8 = (CK_C_GetFunctionList)0x0;
  }
  else {
    local_8 = (CK_C_GetFunctionList)dlsym(local_30,"C_GetFunctionList");
    lVar1 = dlerror();
    *in_RDX = lVar1;
    if (*in_RDX == 0) {
      *in_RSI = local_30;
    }
    else {
      dlclose(local_30);
      local_8 = (CK_C_GetFunctionList)0x0;
    }
  }
  return local_8;
}

Assistant:

CK_C_GetFunctionList loadLibrary(char* module, void** moduleHandle,
				char **pErrMsg)
{
	CK_C_GetFunctionList pGetFunctionList = NULL;

#if defined(HAVE_LOADLIBRARY)
	HINSTANCE hDLL = NULL;
	DWORD dw = NULL;
	static char errMsg[100];

	// Load PKCS #11 library
	if (module)
	{
		hDLL = LoadLibraryA(module);
	}
	else
	{
		hDLL = LoadLibraryA(DEFAULT_PKCS11_LIB);
	}

	if (hDLL == NULL)
	{
		// Failed to load the PKCS #11 library
		dw = GetLastError();
		snprintf((char*)errMsg, sizeof(errMsg), "LoadLibraryA failed: 0x%08X", dw);
		*pErrMsg = errMsg;
		return NULL;
	}
	else
	{
		*pErrMsg = NULL;
	}

	// Retrieve the entry point for C_GetFunctionList
	pGetFunctionList = (CK_C_GetFunctionList) GetProcAddress(hDLL, "C_GetFunctionList");
	if (pGetFunctionList == NULL)
	{
		dw = GetLastError();
		snprintf((char*)errMsg, sizeof(errMsg), "getProcAddress failed: 0x%08X", dw);
		*pErrMsg = errMsg;
		FreeLibrary(hDLL);
		return NULL;
	}

	// Store the handle so we can FreeLibrary it later
	*moduleHandle = hDLL;

#elif defined(HAVE_DLOPEN)
	void* pDynLib = NULL;

	// Load PKCS #11 library
	if (module)
	{
		pDynLib = dlopen(module, RTLD_NOW | RTLD_LOCAL);
	}
	else
	{
		pDynLib = dlopen(DEFAULT_PKCS11_LIB, RTLD_NOW | RTLD_LOCAL);
	}

	*pErrMsg = dlerror();
	if (pDynLib == NULL || *pErrMsg != NULL)
	{
		if (pDynLib != NULL) dlclose(pDynLib);

		// Failed to load the PKCS #11 library
		return NULL;
	}

	// Retrieve the entry point for C_GetFunctionList
	pGetFunctionList = (CK_C_GetFunctionList) dlsym(pDynLib, "C_GetFunctionList");

	// Store the handle so we can dlclose it later
	*pErrMsg = dlerror();
	if (*pErrMsg != NULL)
	{
		dlclose(pDynLib);

		// An error occured during dlsym()
		return NULL;
	}

	*moduleHandle = pDynLib;
#else
	fprintf(stderr, "ERROR: Not compiled with library support.\n");

	return NULL;
#endif

	return pGetFunctionList;
}